

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O0

int __thiscall
GeneticAlgorithm::findMaxCacheNumber
          (GeneticAlgorithm *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parent)

{
  int iVar1;
  size_type sVar2;
  reference pbVar3;
  reference ppCVar4;
  char *__nptr;
  reference pvVar5;
  int iStack_84;
  Video video;
  CacheServer *cacheServer;
  string local_68 [8];
  string gene;
  undefined1 local_48 [8];
  vector<CacheServer_*,_std::allocator<CacheServer_*>_> caches;
  iterator parentIterator;
  int local_20;
  int actualCache;
  int parent1Count;
  int freeSpace1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parent_local;
  GeneticAlgorithm *this_local;
  
  actualCache = -1;
  local_20 = 0;
  parentIterator._M_current._4_4_ = 0;
  caches.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(parent);
  std::vector<CacheServer_*,_std::allocator<CacheServer_*>_>::vector
            ((vector<CacheServer_*,_std::allocator<CacheServer_*>_> *)local_48,
             &(this->dataCenter).caches);
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(parent);
    if ((long)local_20 == sVar2 - 1) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&caches.
                             super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::string(local_68,(string *)pbVar3);
    ppCVar4 = std::vector<CacheServer_*,_std::allocator<CacheServer_*>_>::operator[]
                        ((vector<CacheServer_*,_std::allocator<CacheServer_*>_> *)local_48,
                         (long)parentIterator._M_current._4_4_);
    if (actualCache == -1) {
      actualCache = (int)(*ppCVar4)->maxCapacity;
    }
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar1 = atoi(__nptr);
    pvVar5 = std::vector<Video,_std::allocator<Video>_>::operator[]
                       (&(this->dataCenter).videos,(long)iVar1);
    iStack_84 = (*pvVar5).size;
    if (actualCache < iStack_84) {
      parentIterator._M_current._4_4_ = parentIterator._M_current._4_4_ + 1;
      ppCVar4 = std::vector<CacheServer_*,_std::allocator<CacheServer_*>_>::operator[]
                          ((vector<CacheServer_*,_std::allocator<CacheServer_*>_> *)local_48,
                           (long)parentIterator._M_current._4_4_);
      actualCache = (int)(*ppCVar4)->maxCapacity - iStack_84;
    }
    else {
      actualCache = actualCache - iStack_84;
    }
    local_20 = local_20 + 1;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&caches.super__Vector_base<CacheServer_*,_std::allocator<CacheServer_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    std::__cxx11::string::~string(local_68);
  }
  std::vector<CacheServer_*,_std::allocator<CacheServer_*>_>::~vector
            ((vector<CacheServer_*,_std::allocator<CacheServer_*>_> *)local_48);
  return parentIterator._M_current._4_4_;
}

Assistant:

int GeneticAlgorithm::findMaxCacheNumber(std::vector<std::string> parent) {
    int freeSpace1 = -1;
    int parent1Count = 0;
    int actualCache = 0;
    std::vector<std::string>::iterator parentIterator = parent.begin();
    std::vector<CacheServer *> caches = this->dataCenter.caches;
    for (;;) {
        if(parent1Count == parent.size() -1) break;
        std::string gene  = *parentIterator;
        CacheServer *cacheServer = caches[actualCache];
        if(freeSpace1 == -1) freeSpace1 = cacheServer->maxCapacity;
        Video video = dataCenter.videos[atoi(gene.c_str())];
        if(video.size <= freeSpace1){
            freeSpace1 = freeSpace1 - video.size;
        }
        else{
            actualCache++;
            cacheServer = caches[actualCache];
            freeSpace1 = cacheServer->maxCapacity ;
            freeSpace1 = freeSpace1 - video.size ;
        }
        parent1Count++;
        parentIterator++;
    }
    return actualCache;
}